

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

vector<BigInt,_std::allocator<BigInt>_> * __thiscall
BigInt::div_and_mod(vector<BigInt,_std::allocator<BigInt>_> *__return_storage_ptr__,BigInt *this,
                   BigInt *b)

{
  initializer_list<BigInt> __l;
  initializer_list<BigInt> __l_00;
  initializer_list<BigInt> __l_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  runtime_error *this_00;
  BigInt *local_5c8;
  BigInt *local_510;
  BigInt *local_4c8;
  allocator<BigInt> local_479;
  BigInt *local_478;
  BigInt local_470;
  BigInt local_450;
  undefined1 local_430 [48];
  BigInt local_400;
  BigInt local_3e0;
  BigInt local_3c0;
  BigInt local_3a0;
  BigInt local_380;
  BigInt local_360;
  BigInt local_340;
  BigInt local_320;
  BigInt local_300;
  undefined1 local_2e0 [8];
  BigInt temp;
  BigInt divisor;
  BigInt divided;
  BigInt ans;
  BigInt one;
  BigInt j;
  longlong bint;
  longlong aint;
  string bb;
  string aa;
  int local_170;
  allocator<BigInt> local_169;
  int cost;
  BigInt local_160;
  BigInt local_140;
  undefined1 local_120 [24];
  BigInt *local_108;
  BigInt local_100;
  BigInt local_e0;
  undefined1 local_c0 [24];
  BigInt temp_1;
  BigInt local_70;
  BigInt local_40;
  BigInt *local_20;
  BigInt *b_local;
  BigInt *this_local;
  
  local_20 = b;
  b_local = this;
  this_local = (BigInt *)__return_storage_ptr__;
  BigInt(&local_40,0);
  bVar1 = operator==(b,&local_40);
  ~BigInt(&local_40);
  if (!bVar1) {
    absolute(&local_70,this);
    absolute((BigInt *)&temp_1.real_length,local_20);
    bVar1 = operator<(&local_70,(BigInt *)&temp_1.real_length);
    ~BigInt((BigInt *)&temp_1.real_length);
    ~BigInt(&local_70);
    if (bVar1) {
      BigInt((BigInt *)(local_c0 + 0x10),this);
      local_108 = &local_100;
      BigInt(local_108,0);
      local_108 = &local_e0;
      BigInt(local_108,(BigInt *)(local_c0 + 0x10));
      local_c0._0_8_ = &local_100;
      local_c0._8_8_ = (pointer)0x2;
      std::allocator<BigInt>::allocator((allocator<BigInt> *)(local_120 + 0x17));
      __l_01._M_len = local_c0._8_8_;
      __l_01._M_array = (iterator)local_c0._0_8_;
      std::vector<BigInt,_std::allocator<BigInt>_>::vector
                (__return_storage_ptr__,__l_01,(allocator<BigInt> *)(local_120 + 0x17));
      std::allocator<BigInt>::~allocator((allocator<BigInt> *)(local_120 + 0x17));
      local_4c8 = (BigInt *)local_c0;
      do {
        local_4c8 = local_4c8 + -1;
        ~BigInt(local_4c8);
      } while (local_4c8 != &local_100);
      ~BigInt((BigInt *)(local_c0 + 0x10));
    }
    else {
      bVar1 = operator==(this,local_20);
      if (bVar1) {
        _cost = &local_160;
        BigInt(_cost,1);
        _cost = &local_140;
        BigInt(_cost,0);
        local_120._0_8_ = &local_160;
        local_120._8_8_ = (pointer)0x2;
        std::allocator<BigInt>::allocator(&local_169);
        __l_00._M_len = local_120._8_8_;
        __l_00._M_array = (iterator)local_120._0_8_;
        std::vector<BigInt,_std::allocator<BigInt>_>::vector
                  (__return_storage_ptr__,__l_00,&local_169);
        std::allocator<BigInt>::~allocator(&local_169);
        local_510 = (BigInt *)local_120;
        do {
          local_510 = local_510 + -1;
          ~BigInt(local_510);
        } while (local_510 != &local_160);
      }
      else {
        local_170 = get_real_length(this);
        iVar3 = get_real_length(local_20);
        BigInt((BigInt *)&one.real_length,0);
        BigInt((BigInt *)&ans.real_length,1);
        BigInt((BigInt *)&divided.real_length,1);
        absolute((BigInt *)&divisor.real_length,this);
        absolute((BigInt *)&temp.real_length,local_20);
        BigInt((BigInt *)local_2e0,1);
        for (local_170 = local_170 - iVar3; -1 < local_170; local_170 = local_170 + -1) {
          BigInt(&local_300,0);
          operator=((BigInt *)&one.real_length,&local_300);
          ~BigInt(&local_300);
          while( true ) {
            operator*(&local_340,(BigInt *)&one.real_length,(BigInt *)&temp.real_length);
            multi_ten(&local_320,&local_340,local_170);
            bVar1 = operator>=((BigInt *)&divisor.real_length,&local_320);
            ~BigInt(&local_320);
            ~BigInt(&local_340);
            if (!bVar1) break;
            operator+(&local_360,(BigInt *)&one.real_length,(BigInt *)&ans.real_length);
            operator=((BigInt *)&one.real_length,&local_360);
            ~BigInt(&local_360);
          }
          operator-(&local_380,(BigInt *)&one.real_length,(BigInt *)&ans.real_length);
          operator=((BigInt *)&one.real_length,&local_380);
          ~BigInt(&local_380);
          multi_ten(&local_3a0,(BigInt *)&one.real_length,local_170);
          operator=((BigInt *)local_2e0,&local_3a0);
          ~BigInt(&local_3a0);
          operator+(&local_3c0,(BigInt *)&divided.real_length,(BigInt *)local_2e0);
          operator=((BigInt *)&divided.real_length,&local_3c0);
          ~BigInt(&local_3c0);
          operator*(&local_400,(BigInt *)&temp.real_length,(BigInt *)local_2e0);
          operator-(&local_3e0,(BigInt *)&divisor.real_length,&local_400);
          operator=((BigInt *)&divisor.real_length,&local_3e0);
          ~BigInt(&local_3e0);
          ~BigInt(&local_400);
        }
        operator-((BigInt *)(local_430 + 0x10),(BigInt *)&divided.real_length,
                  (BigInt *)&ans.real_length);
        operator=((BigInt *)&divided.real_length,(BigInt *)(local_430 + 0x10));
        ~BigInt((BigInt *)(local_430 + 0x10));
        bVar1 = get_positive_sign(this);
        bVar2 = get_positive_sign(local_20);
        set_sign((BigInt *)&divided.real_length,bVar1 == bVar2);
        bVar1 = get_positive_sign(this);
        set_sign((BigInt *)&divisor.real_length,bVar1);
        local_478 = &local_470;
        BigInt(local_478,(BigInt *)&divided.real_length);
        local_478 = &local_450;
        BigInt(local_478,(BigInt *)&divisor.real_length);
        local_430._0_8_ = &local_470;
        local_430._8_8_ = (pointer)0x2;
        std::allocator<BigInt>::allocator(&local_479);
        __l._M_len = local_430._8_8_;
        __l._M_array = (iterator)local_430._0_8_;
        std::vector<BigInt,_std::allocator<BigInt>_>::vector(__return_storage_ptr__,__l,&local_479);
        std::allocator<BigInt>::~allocator(&local_479);
        local_5c8 = (BigInt *)local_430;
        do {
          local_5c8 = local_5c8 + -1;
          ~BigInt(local_5c8);
        } while (local_5c8 != &local_470);
        ~BigInt((BigInt *)local_2e0);
        ~BigInt((BigInt *)&temp.real_length);
        ~BigInt((BigInt *)&divisor.real_length);
        ~BigInt((BigInt *)&divided.real_length);
        ~BigInt((BigInt *)&ans.real_length);
        ~BigInt((BigInt *)&one.real_length);
      }
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"ERROR zero, 0 could not be the divisor");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

vector<BigInt> BigInt::div_and_mod(BigInt& b) {
    if (b == 0) {
        throw runtime_error("ERROR zero, 0 could not be the divisor");
    }
    if (this->absolute() < b.absolute()) {
        BigInt temp = *this;
        return vector<BigInt>{BigInt(0), temp};
    }
    if (*this == b) {
        return vector<BigInt>{BigInt(1), BigInt(0)};
    }
    int cost = this->get_real_length();
    if (cost < 20 && false) {
        string aa = this->to_string();
        string bb = b.to_string();
        long long int aint = stoll(aa, nullptr, 10);
        long long int bint = stoll(bb, nullptr, 10);
        return vector<BigInt>{BigInt(aint / bint), BigInt(aint % bint)};
    }
    cost -= b.get_real_length();
    BigInt j(0);
    BigInt one(1);
    BigInt ans(1);
    BigInt divided = this->absolute();
    BigInt divisor = b.absolute();
    BigInt temp(1);
    while (cost >= 0) {
        j = 0;
        while (divided >= (j * divisor).multi_ten(cost)) {
            j = j + one;
        }
        j = j - one;
        temp = j.multi_ten(cost);
        ans = ans + temp;
        divided = divided - divisor * temp;
        cost -= 1;
    }
    ans = ans - one;
    ans.set_sign(this->get_positive_sign() == b.get_positive_sign() ? true : false);
    divided.set_sign(this->get_positive_sign());
    return vector<BigInt>{ans, divided};
}